

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall Buffer_copyout_some_Test::TestBody(Buffer_copyout_some_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertHelper local_1a8;
  string allstrs;
  size_t n_got;
  size_type n_expected;
  size_t n_pages;
  size_t n_writable;
  size_t n_readable;
  BufferWithReadonlyStrings local;
  array<char,_128UL> array;
  
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local);
  n_readable = bfy_buffer_get_content_len(&local.buf);
  n_writable = bfy_buffer_get_space_len(&local.buf);
  n_pages = anon_unknown.dwarf_1862d::buffer_count_pages(&local.buf,0xffffffffffffffff);
  array._M_elems[0x70] = '\0';
  array._M_elems[0x71] = '\0';
  array._M_elems[0x72] = '\0';
  array._M_elems[0x73] = '\0';
  array._M_elems[0x74] = '\0';
  array._M_elems[0x75] = '\0';
  array._M_elems[0x76] = '\0';
  array._M_elems[0x77] = '\0';
  array._M_elems[0x78] = '\0';
  array._M_elems[0x79] = '\0';
  array._M_elems[0x7a] = '\0';
  array._M_elems[0x7b] = '\0';
  array._M_elems[0x7c] = '\0';
  array._M_elems[0x7d] = '\0';
  array._M_elems[0x7e] = '\0';
  array._M_elems[0x7f] = '\0';
  array._M_elems[0x60] = '\0';
  array._M_elems[0x61] = '\0';
  array._M_elems[0x62] = '\0';
  array._M_elems[99] = '\0';
  array._M_elems[100] = '\0';
  array._M_elems[0x65] = '\0';
  array._M_elems[0x66] = '\0';
  array._M_elems[0x67] = '\0';
  array._M_elems[0x68] = '\0';
  array._M_elems[0x69] = '\0';
  array._M_elems[0x6a] = '\0';
  array._M_elems[0x6b] = '\0';
  array._M_elems[0x6c] = '\0';
  array._M_elems[0x6d] = '\0';
  array._M_elems[0x6e] = '\0';
  array._M_elems[0x6f] = '\0';
  array._M_elems[0x50] = '\0';
  array._M_elems[0x51] = '\0';
  array._M_elems[0x52] = '\0';
  array._M_elems[0x53] = '\0';
  array._M_elems[0x54] = '\0';
  array._M_elems[0x55] = '\0';
  array._M_elems[0x56] = '\0';
  array._M_elems[0x57] = '\0';
  array._M_elems[0x58] = '\0';
  array._M_elems[0x59] = '\0';
  array._M_elems[0x5a] = '\0';
  array._M_elems[0x5b] = '\0';
  array._M_elems[0x5c] = '\0';
  array._M_elems[0x5d] = '\0';
  array._M_elems[0x5e] = '\0';
  array._M_elems[0x5f] = '\0';
  array._M_elems[0x40] = '\0';
  array._M_elems[0x41] = '\0';
  array._M_elems[0x42] = '\0';
  array._M_elems[0x43] = '\0';
  array._M_elems[0x44] = '\0';
  array._M_elems[0x45] = '\0';
  array._M_elems[0x46] = '\0';
  array._M_elems[0x47] = '\0';
  array._M_elems[0x48] = '\0';
  array._M_elems[0x49] = '\0';
  array._M_elems[0x4a] = '\0';
  array._M_elems[0x4b] = '\0';
  array._M_elems[0x4c] = '\0';
  array._M_elems[0x4d] = '\0';
  array._M_elems[0x4e] = '\0';
  array._M_elems[0x4f] = '\0';
  array._M_elems[0x30] = '\0';
  array._M_elems[0x31] = '\0';
  array._M_elems[0x32] = '\0';
  array._M_elems[0x33] = '\0';
  array._M_elems[0x34] = '\0';
  array._M_elems[0x35] = '\0';
  array._M_elems[0x36] = '\0';
  array._M_elems[0x37] = '\0';
  array._M_elems[0x38] = '\0';
  array._M_elems[0x39] = '\0';
  array._M_elems[0x3a] = '\0';
  array._M_elems[0x3b] = '\0';
  array._M_elems[0x3c] = '\0';
  array._M_elems[0x3d] = '\0';
  array._M_elems[0x3e] = '\0';
  array._M_elems[0x3f] = '\0';
  array._M_elems[0x20] = '\0';
  array._M_elems[0x21] = '\0';
  array._M_elems[0x22] = '\0';
  array._M_elems[0x23] = '\0';
  array._M_elems[0x24] = '\0';
  array._M_elems[0x25] = '\0';
  array._M_elems[0x26] = '\0';
  array._M_elems[0x27] = '\0';
  array._M_elems[0x28] = '\0';
  array._M_elems[0x29] = '\0';
  array._M_elems[0x2a] = '\0';
  array._M_elems[0x2b] = '\0';
  array._M_elems[0x2c] = '\0';
  array._M_elems[0x2d] = '\0';
  array._M_elems[0x2e] = '\0';
  array._M_elems[0x2f] = '\0';
  array._M_elems[0x10] = '\0';
  array._M_elems[0x11] = '\0';
  array._M_elems[0x12] = '\0';
  array._M_elems[0x13] = '\0';
  array._M_elems[0x14] = '\0';
  array._M_elems[0x15] = '\0';
  array._M_elems[0x16] = '\0';
  array._M_elems[0x17] = '\0';
  array._M_elems[0x18] = '\0';
  array._M_elems[0x19] = '\0';
  array._M_elems[0x1a] = '\0';
  array._M_elems[0x1b] = '\0';
  array._M_elems[0x1c] = '\0';
  array._M_elems[0x1d] = '\0';
  array._M_elems[0x1e] = '\0';
  array._M_elems[0x1f] = '\0';
  array._M_elems[0] = '\0';
  array._M_elems[1] = '\0';
  array._M_elems[2] = '\0';
  array._M_elems[3] = '\0';
  array._M_elems[4] = '\0';
  array._M_elems[5] = '\0';
  array._M_elems[6] = '\0';
  array._M_elems[7] = '\0';
  array._M_elems[8] = '\0';
  array._M_elems[9] = '\0';
  array._M_elems[10] = '\0';
  array._M_elems[0xb] = '\0';
  array._M_elems[0xc] = '\0';
  array._M_elems[0xd] = '\0';
  array._M_elems[0xe] = '\0';
  array._M_elems[0xf] = '\0';
  n_expected = 0x1b;
  n_got = bfy_buffer_copyout(&local.buf,0x1b,&array);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&allstrs,"n_expected","n_got",&n_expected,&n_got);
  if ((char)allstrs._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (allstrs._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)allstrs._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x30e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&allstrs._M_string_length);
  std::__cxx11::string::string((string *)&allstrs,&local.allstrs);
  bVar1 = std::__equal<true>::equal<char>
                    (array._M_elems,array._M_elems + n_got,
                     (char *)CONCAT71(allstrs._M_dataplus._M_p._1_7_,(char)allstrs._M_dataplus._M_p)
                    );
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1,(internal *)&gtest_ar_,
               (AssertionResult *)
               "std::equal(std::data(array), std::data(array)+n_got, std::data(allstrs))","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x310,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    if (local_1e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = bfy_buffer_get_content_len(&local.buf);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_1,"n_readable","bfy_buffer_get_content_len(&local.buf)",
             &n_readable,(unsigned_long *)&gtest_ar_);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x313,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  gtest_ar_._0_8_ = bfy_buffer_get_space_len(&local.buf);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_1,"n_writable","bfy_buffer_get_space_len(&local.buf)",&n_writable
             ,(unsigned_long *)&gtest_ar_);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x314,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  gtest_ar_._0_8_ = anon_unknown.dwarf_1862d::buffer_count_pages(&local.buf,0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_1,"n_pages","buffer_count_pages(&local.buf)",&n_pages,
             (unsigned_long *)&gtest_ar_);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x315,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&allstrs);
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local);
  return;
}

Assistant:

TEST(Buffer, copyout_some) {
    auto local = BufferWithReadonlyStrings {};
    auto const n_readable = bfy_buffer_get_content_len(&local.buf);
    auto const n_writable = bfy_buffer_get_space_len(&local.buf);
    auto const n_pages = buffer_count_pages(&local.buf);

    // copy out some of it
    auto array = std::array<char, 128>{};
    auto constexpr n_expected = std::size(str1) + 1;
    auto const n_got = bfy_buffer_copyout(&local.buf, n_expected, std::data(array));

    // confirm we got what we expected
    EXPECT_EQ(n_expected, n_got);
    auto const allstrs = local.allstrs;
    EXPECT_TRUE(std::equal(std::data(array), std::data(array)+n_got, std::data(allstrs)));

    // confirm that buffer is unchanged
    EXPECT_EQ(n_readable, bfy_buffer_get_content_len(&local.buf));
    EXPECT_EQ(n_writable, bfy_buffer_get_space_len(&local.buf));
    EXPECT_EQ(n_pages, buffer_count_pages(&local.buf));
}